

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

string * __thiscall
Catch::Detail::stringify<C_A_T_C_H_T_E_S_T_160()::t1>
          (string *__return_storage_ptr__,Detail *this,t1 *e)

{
  t1 *e_local;
  
  StringMaker<C_A_T_C_H_T_E_S_T_160()::t1,void>::convert<C_A_T_C_H_T_E_S_T_160()::t1>
            (__return_storage_ptr__,(StringMaker<C_A_T_C_H_T_E_S_T_160()::t1,void> *)this,e);
  return __return_storage_ptr__;
}

Assistant:

std::string stringify(const T& e) {
            return ::Catch::StringMaker<typename std::remove_cv<typename std::remove_reference<T>::type>::type>::convert(e);
        }